

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

ON_wString __thiscall
ON_wString::RemovePrefix(ON_wString *this,wchar_t *prefix,ON_Locale *locale,bool bIgnoreCase)

{
  bool bVar1;
  int iVar2;
  int element_count1;
  wchar_t *string1;
  undefined7 in_register_00000009;
  byte in_R8B;
  int prefix_length;
  int str_len;
  wchar_t *str;
  bool bIgnoreCase_local;
  ON_Locale *locale_local;
  wchar_t *prefix_local;
  ON_wString *this_local;
  ON_wString *s;
  
  string1 = operator_cast_to_wchar_t_((ON_wString *)prefix);
  iVar2 = Length((ON_wString *)prefix);
  element_count1 = Length((wchar_t *)locale);
  if (((element_count1 < 1) || (iVar2 < element_count1)) ||
     (bVar1 = Equal(string1,element_count1,(wchar_t *)locale,element_count1,
                    (ON_Locale *)CONCAT71(in_register_00000009,bIgnoreCase),(bool)(in_R8B & 1)),
     !bVar1)) {
    ON_wString(this,(ON_wString *)prefix);
  }
  else {
    ON_wString(this);
    CopyToArray(this,iVar2 - element_count1,string1 + element_count1);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::RemovePrefix(
  const wchar_t* prefix,
  const class ON_Locale& locale,
  bool bIgnoreCase
) const
{
  const wchar_t* str = static_cast<const wchar_t*>(*this);
  const int str_len = Length();
  const int prefix_length = ON_wString::Length(prefix);
  if (
    prefix_length > 0
    && str_len >= prefix_length
    && ON_wString::Equal(
      str,
      prefix_length,
      prefix,
      prefix_length,
      locale,
      bIgnoreCase)
    )
  {
    ON_wString s;
    s.CopyToArray(str_len - prefix_length, str + prefix_length);
    return s;
  }

  return *this;
}